

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O3

void __thiscall Fl_Tabs::client_area(Fl_Tabs *this,int *rx,int *ry,int *rw,int *rh,int tabh)

{
  int iVar1;
  Fl_Widget **ppFVar2;
  
  if ((this->super_Fl_Group).children_ == 0) {
    iVar1 = fl_height((this->super_Fl_Group).super_Fl_Widget.label_.font,
                      (this->super_Fl_Group).super_Fl_Widget.label_.size);
    if (tabh == -1) {
      tabh = -4 - iVar1;
    }
    else if (tabh == 0) {
      tabh = iVar1 + 4;
    }
    *rx = (this->super_Fl_Group).super_Fl_Widget.x_;
    *rw = (this->super_Fl_Group).super_Fl_Widget.w_;
    iVar1 = (this->super_Fl_Group).super_Fl_Widget.y_;
    if (tabh < 0) {
      *ry = iVar1;
      iVar1 = tabh + (this->super_Fl_Group).super_Fl_Widget.h_;
    }
    else {
      *ry = iVar1 + tabh;
      iVar1 = (this->super_Fl_Group).super_Fl_Widget.h_ - tabh;
    }
  }
  else {
    ppFVar2 = Fl_Group::array(&this->super_Fl_Group);
    *rx = (*ppFVar2)->x_;
    ppFVar2 = Fl_Group::array(&this->super_Fl_Group);
    *ry = (*ppFVar2)->y_;
    ppFVar2 = Fl_Group::array(&this->super_Fl_Group);
    *rw = (*ppFVar2)->w_;
    ppFVar2 = Fl_Group::array(&this->super_Fl_Group);
    iVar1 = (*ppFVar2)->h_;
  }
  *rh = iVar1;
  return;
}

Assistant:

void Fl_Tabs::client_area(int &rx, int &ry, int &rw, int &rh, int tabh) {

  if (children()) {			// use existing values

    rx = child(0)->x();
    ry = child(0)->y();
    rw = child(0)->w();
    rh = child(0)->h();

  } else {				// calculate values

    int y_offset;
    int label_height = fl_height(labelfont(), labelsize()) + BORDER*2;

    if (tabh == 0)			// use default (at top)
      y_offset = label_height;
    else if (tabh == -1)	 	// use default (at bottom)
      y_offset = -label_height;
    else
      y_offset = tabh;			// user given value

    rx = x();
    rw = w();

    if (y_offset >= 0) {		// labels at top
      ry = y() + y_offset;
      rh = h() - y_offset;
    } else {				// labels at bottom
      ry = y();
      rh = h() + y_offset;
    }
  }
}